

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

void __thiscall
pbrt::SobolSampler::SobolSampler
          (SobolSampler *this,int spp,Point2i *fullResolution,RandomizeStrategy randomizeStrategy)

{
  bool bVar1;
  int32_t iVar2;
  int *piVar3;
  int32_t in_ECX;
  int *in_RDX;
  int32_t in_ESI;
  int32_t *in_RDI;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = RoundUpPow2(in_ESI);
  *in_RDI = iVar2;
  in_RDI[2] = in_ECX;
  Point2<int>::Point2((Point2<int> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  in_RDI[5] = 0;
  bVar1 = IsPowerOf2<int>(in_ESI);
  if (!bVar1) {
    Warning<int&>((char *)fullResolution,(int *)CONCAT44(randomizeStrategy,in_stack_00000008));
  }
  piVar3 = std::max<int>(in_RDX,in_RDX + 1);
  iVar2 = RoundUpPow2(*piVar3);
  in_RDI[1] = iVar2;
  return;
}

Assistant:

SobolSampler(int spp, const Point2i &fullResolution,
                 RandomizeStrategy randomizeStrategy)
        : samplesPerPixel(RoundUpPow2(spp)), randomizeStrategy(randomizeStrategy) {
        if (!IsPowerOf2(spp))
            Warning("Non power-of-two sample count rounded up to %d "
                    "for SobolSampler.",
                    samplesPerPixel);
        resolution = RoundUpPow2(std::max(fullResolution.x, fullResolution.y));
    }